

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O1

void Seg_ManClean(Seg_Man_t *p)

{
  byte bVar1;
  int iVar2;
  sat_solver *psVar3;
  int **ppiVar4;
  int iVar5;
  long lVar6;
  timespec ts;
  timespec local_18;
  
  iVar5 = clock_gettime(3,&local_18);
  if (iVar5 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_18.tv_nsec / 1000 + local_18.tv_sec * 1000000;
  }
  p->timeStart = lVar6;
  sat_solver_rollback(p->pSat);
  psVar3 = p->pSat;
  if (psVar3->qhead == psVar3->qtail) {
    iVar5 = psVar3->size;
    psVar3->iVarPivot = iVar5;
    psVar3->iTrailPivot = psVar3->qhead;
    *(undefined8 *)(psVar3->Mem).BookMarkE = *(undefined8 *)(psVar3->Mem).nEntries;
    iVar2 = (psVar3->Mem).iPage[0];
    bVar1 = (byte)(psVar3->Mem).nPageSize;
    ppiVar4 = (psVar3->Mem).pPages;
    (psVar3->Mem).BookMarkH[0] = iVar2 << (bVar1 & 0x1f) | *ppiVar4[iVar2];
    iVar2 = (psVar3->Mem).iPage[1];
    (psVar3->Mem).BookMarkH[1] = iVar2 << (bVar1 & 0x1f) | *ppiVar4[iVar2];
    if (psVar3->activity2 != (uint *)0x0) {
      psVar3->var_inc2 = psVar3->var_inc;
      memcpy(psVar3->activity2,psVar3->activity,(long)iVar5 << 2);
    }
    p->vEdges->nSize = 0;
    p->vFirsts->nSize = 0;
    p->vNvars->nSize = 0;
    p->vLits->nSize = 0;
    p->vPolars->nSize = 0;
    p->vToSkip->nSize = 0;
    Gia_ManFillValue(p->pGia);
    return;
  }
  __assert_fail("s->qhead == s->qtail",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                ,0x114,"void sat_solver_bookmark(sat_solver *)");
}

Assistant:

void Seg_ManClean( Seg_Man_t * p )
{
    p->timeStart = Abc_Clock();
    sat_solver_rollback( p->pSat );
    sat_solver_bookmark( p->pSat );
    // internal
    Vec_IntClear( p->vEdges );
    Vec_IntClear( p->vFirsts );
    Vec_IntClear( p->vNvars );
    Vec_IntClear( p->vLits );
    Vec_IntClear( p->vPolars );
    Vec_IntClear( p->vToSkip );
    // other
    Gia_ManFillValue( p->pGia );
}